

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int selectWindowRewriteExprCb(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  uint uVar2;
  Parse *pParse;
  WindowRewrite *pWVar3;
  Expr *pExpr_00;
  ExprList *pEVar4;
  int *piVar5;
  Window *pWVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  
  pParse = pWalker->pParse;
  pWVar3 = (pWalker->u).pRewrite;
  if (pWVar3->pSubSelect != (Select *)0x0) {
    if (pExpr->op != 0xa2) {
      return 0;
    }
    uVar2 = pWVar3->pSrc->nSrc;
    uVar7 = 0;
    if (0 < (int)uVar2) {
      piVar5 = &pWVar3->pSrc->a[0].iCursor;
      uVar7 = 0;
      do {
        if (pExpr->iTable == *piVar5) goto LAB_00184aa8;
        uVar7 = uVar7 + 1;
        piVar5 = piVar5 + 0x1c;
      } while (uVar2 != uVar7);
      uVar7 = (ulong)uVar2;
    }
LAB_00184aa8:
    if ((uint)uVar7 == uVar2) {
      return 0;
    }
  }
  if (1 < pExpr->op - 0xa2) {
    if (pExpr->op != 0xa1) {
      return 0;
    }
    if ((pExpr->flags & 0x1000000) == 0) {
      return 0;
    }
    pWVar6 = pWVar3->pWin;
    iVar8 = 0;
    bVar9 = pWVar6 == (Window *)0x0;
    if (!bVar9) {
      do {
        if ((Window *)(pExpr->y).pTab == pWVar6) {
          iVar8 = 1;
          break;
        }
        pWVar6 = pWVar6->pNextWin;
        bVar9 = pWVar6 == (Window *)0x0;
      } while (!bVar9);
    }
    if (!bVar9) {
      return iVar8;
    }
  }
  pExpr_00 = exprDup(pParse->db,pExpr,0,(u8 **)0x0);
  pEVar4 = sqlite3ExprListAppend(pParse,pWVar3->pSub,pExpr_00);
  pWVar3->pSub = pEVar4;
  if (pEVar4 != (ExprList *)0x0) {
    pbVar1 = (byte *)((long)&pExpr->flags + 3);
    *pbVar1 = *pbVar1 | 8;
    sqlite3ExprDeleteNN(pParse->db,pExpr);
    pbVar1 = (byte *)((long)&pExpr->flags + 3);
    *pbVar1 = *pbVar1 & 0xf7;
    pExpr->op = '\0';
    pExpr->affinity = '\0';
    *(undefined2 *)&pExpr->field_0x2 = 0;
    pExpr->flags = 0;
    (pExpr->u).zToken = (char *)0x0;
    pExpr->pLeft = (Expr *)0x0;
    pExpr->pRight = (Expr *)0x0;
    (pExpr->x).pList = (ExprList *)0x0;
    pExpr->nHeight = 0;
    pExpr->iTable = 0;
    pExpr->iColumn = 0;
    pExpr->iAgg = 0;
    pExpr->iRightJoinTable = 0;
    pExpr->op2 = '\0';
    pExpr->field_0x37 = 0;
    pExpr->pAggInfo = (AggInfo *)0x0;
    (pExpr->y).pTab = (Table *)0x0;
    pExpr->op = 0xa2;
    pExpr->iColumn = (short)pWVar3->pSub->nExpr + -1;
    pExpr->iTable = pWVar3->pWin->iEphCsr;
  }
  return 0;
}

Assistant:

static int selectWindowRewriteExprCb(Walker *pWalker, Expr *pExpr){
  struct WindowRewrite *p = pWalker->u.pRewrite;
  Parse *pParse = pWalker->pParse;

  /* If this function is being called from within a scalar sub-select
  ** that used by the SELECT statement being processed, only process
  ** TK_COLUMN expressions that refer to it (the outer SELECT). Do
  ** not process aggregates or window functions at all, as they belong
  ** to the scalar sub-select.  */
  if( p->pSubSelect ){
    if( pExpr->op!=TK_COLUMN ){
      return WRC_Continue;
    }else{
      int nSrc = p->pSrc->nSrc;
      int i;
      for(i=0; i<nSrc; i++){
        if( pExpr->iTable==p->pSrc->a[i].iCursor ) break;
      }
      if( i==nSrc ) return WRC_Continue;
    }
  }

  switch( pExpr->op ){

    case TK_FUNCTION:
      if( !ExprHasProperty(pExpr, EP_WinFunc) ){
        break;
      }else{
        Window *pWin;
        for(pWin=p->pWin; pWin; pWin=pWin->pNextWin){
          if( pExpr->y.pWin==pWin ){
            assert( pWin->pOwner==pExpr );
            return WRC_Prune;
          }
        }
      }
      /* Fall through.  */

    case TK_AGG_FUNCTION:
    case TK_COLUMN: {
      Expr *pDup = sqlite3ExprDup(pParse->db, pExpr, 0);
      p->pSub = sqlite3ExprListAppend(pParse, p->pSub, pDup);
      if( p->pSub ){
        assert( ExprHasProperty(pExpr, EP_Static)==0 );
        ExprSetProperty(pExpr, EP_Static);
        sqlite3ExprDelete(pParse->db, pExpr);
        ExprClearProperty(pExpr, EP_Static);
        memset(pExpr, 0, sizeof(Expr));

        pExpr->op = TK_COLUMN;
        pExpr->iColumn = p->pSub->nExpr-1;
        pExpr->iTable = p->pWin->iEphCsr;
      }

      break;
    }

    default: /* no-op */
      break;
  }

  return WRC_Continue;
}